

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O2

KBOOL __thiscall KDIS::DATA_TYPE::COMBICState::operator==(COMBICState *this,COMBICState *Value)

{
  KBOOL KVar1;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (((((!KVar1) && (this->m_ui32TSC == Value->m_ui32TSC)) &&
       (KVar1 = EntityType::operator!=(&this->m_MunSrc,&Value->m_MunSrc), !KVar1)) &&
      ((this->m_ui32NumSrcs == Value->m_ui32NumSrcs &&
       (this->m_ui16GeometryIndex == Value->m_ui16GeometryIndex)))) &&
     (this->m_ui32SrcType == Value->m_ui32SrcType)) {
    if (((float)this->m_f32BarrageRate == (float)Value->m_f32BarrageRate) &&
       (!NAN((float)this->m_f32BarrageRate) && !NAN((float)Value->m_f32BarrageRate))) {
      if (((float)this->m_f32BarrageDuration == (float)Value->m_f32BarrageDuration) &&
         (!NAN((float)this->m_f32BarrageDuration) && !NAN((float)Value->m_f32BarrageDuration))) {
        if (((float)this->m_f32BarrageCrosswindLength == (float)Value->m_f32BarrageCrosswindLength)
           && (!NAN((float)this->m_f32BarrageCrosswindLength) &&
               !NAN((float)Value->m_f32BarrageCrosswindLength))) {
          if (((float)this->m_f32BarrageDownwindLength == (float)Value->m_f32BarrageDownwindLength)
             && (!NAN((float)this->m_f32BarrageDownwindLength) &&
                 !NAN((float)Value->m_f32BarrageDownwindLength))) {
            KVar1 = EulerAngles::operator!=(&this->m_DetVel,&Value->m_DetVel);
            return !KVar1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL COMBICState::operator == ( const COMBICState & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )                          return false;
    if( m_ui32TSC                   != Value.m_ui32TSC )                   return false;
    if( m_MunSrc                    != Value.m_MunSrc )                    return false;
    if( m_ui32NumSrcs               != Value.m_ui32NumSrcs )               return false;
    if( m_ui16GeometryIndex         != Value.m_ui16GeometryIndex )         return false;
    if( m_ui32SrcType               != Value.m_ui32SrcType )               return false;
    if( m_f32BarrageRate            != Value.m_f32BarrageRate )            return false;
    if( m_f32BarrageDuration        != Value.m_f32BarrageDuration )        return false;
    if( m_f32BarrageCrosswindLength != Value.m_f32BarrageCrosswindLength ) return false;
    if( m_f32BarrageDownwindLength  != Value.m_f32BarrageDownwindLength )  return false;
    if( m_DetVel                    != Value.m_DetVel )                    return false;
    return true;
}